

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall annealing::print(annealing *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"STEP: ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ENERGY: ",9);
  poVar1 = std::ostream::_M_insert<double>(this->old_energy);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," TEMPERATURE: ",0xe);
  poVar1 = std::ostream::_M_insert<double>((double)this->temperature);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print() {
        std::cout << "STEP: " << step_num <<" ENERGY: " << old_energy << " TEMPERATURE: " << temperature << std::endl;
    }